

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_partial_sig_parse
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *sig,uchar *in32)

{
  int overflow;
  secp256k1_scalar tmp;
  int local_34;
  secp256k1_scalar local_30;
  
  if (sig == (secp256k1_musig_partial_sig *)0x0) {
    secp256k1_musig_partial_sig_parse_cold_2();
  }
  else {
    if (in32 != (uchar *)0x0) {
      sig->data[0x10] = '\0';
      sig->data[0x11] = '\0';
      sig->data[0x12] = '\0';
      sig->data[0x13] = '\0';
      sig->data[0x14] = '\0';
      sig->data[0x15] = '\0';
      sig->data[0x16] = '\0';
      sig->data[0x17] = '\0';
      sig->data[0x18] = '\0';
      sig->data[0x19] = '\0';
      sig->data[0x1a] = '\0';
      sig->data[0x1b] = '\0';
      sig->data[0x1c] = '\0';
      sig->data[0x1d] = '\0';
      sig->data[0x1e] = '\0';
      sig->data[0x1f] = '\0';
      sig->data[0] = '\0';
      sig->data[1] = '\0';
      sig->data[2] = '\0';
      sig->data[3] = '\0';
      sig->data[4] = '\0';
      sig->data[5] = '\0';
      sig->data[6] = '\0';
      sig->data[7] = '\0';
      sig->data[8] = '\0';
      sig->data[9] = '\0';
      sig->data[10] = '\0';
      sig->data[0xb] = '\0';
      sig->data[0xc] = '\0';
      sig->data[0xd] = '\0';
      sig->data[0xe] = '\0';
      sig->data[0xf] = '\0';
      sig->data[0x20] = '\0';
      sig->data[0x21] = '\0';
      sig->data[0x22] = '\0';
      sig->data[0x23] = '\0';
      secp256k1_scalar_set_b32(&local_30,in32,&local_34);
      if (local_34 != 0) {
        return 0;
      }
      sig->data[0] = 0xeb;
      sig->data[1] = 0xfb;
      sig->data[2] = '\x1a';
      sig->data[3] = '2';
      secp256k1_scalar_get_b32(sig->data + 4,&local_30);
      return 1;
    }
    secp256k1_musig_partial_sig_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_parse(const secp256k1_context* ctx, secp256k1_musig_partial_sig* sig, const unsigned char *in32) {
    secp256k1_scalar tmp;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(in32 != NULL);

    /* Ensure that using the signature will fail if parsing fails (and the user
     * doesn't check the return value). */
    memset(sig, 0, sizeof(*sig));

    secp256k1_scalar_set_b32(&tmp, in32, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_musig_partial_sig_save(sig, &tmp);
    return 1;
}